

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::js::anon_unknown_0::FileDeduplicator::AddFile
          (FileDeduplicator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *filenames,void *desc)

{
  mapped_type pvVar1;
  undefined1 uVar2;
  iterator iVar3;
  mapped_type *ppvVar4;
  mapped_type *pmVar5;
  mapped_type short_name_desc;
  mapped_type local_30;
  mapped_type local_28;
  
  local_30 = desc;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
                  *)this,&filenames->first);
  if ((_Rb_tree_header *)iVar3._M_node !=
      &(this->descs_by_shortname_)._M_t._M_impl.super__Rb_tree_header) {
    ppvVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
              ::operator[](&this->descs_by_shortname_,&filenames->first);
    local_28 = *ppvVar4;
    std::
    map<const_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&this->allowed_descs_full_name_,&local_28);
    pmVar5 = std::
             map<const_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->allowed_descs_actual_name_,&local_28);
    std::__cxx11::string::_M_assign((string *)pmVar5);
  }
  pvVar1 = local_30;
  ppvVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
            ::operator[](&this->descs_by_shortname_,&filenames->first);
  *ppvVar4 = pvVar1;
  pmVar5 = std::
           map<const_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->allowed_descs_actual_name_,&local_30);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  pmVar5 = std::
           map<const_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->allowed_descs_full_name_,&local_30);
  uVar2 = std::__cxx11::string::_M_assign((string *)pmVar5);
  return (bool)uVar2;
}

Assistant:

bool AddFile(const std::pair<std::string, std::string> filenames,
               const void* desc) {
    if (descs_by_shortname_.find(filenames.first) !=
        descs_by_shortname_.end()) {
      // Change old pointer's actual name to full name.
      auto short_name_desc = descs_by_shortname_[filenames.first];
      allowed_descs_actual_name_[short_name_desc] =
          allowed_descs_full_name_[short_name_desc];
    }
    descs_by_shortname_[filenames.first] = desc;
    allowed_descs_actual_name_[desc] = filenames.first;
    allowed_descs_full_name_[desc] = filenames.second;

    return true;
  }